

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctsa.c
# Opt level: O0

myarima_object
myarima(double *x,int N,int *order,int *seasonal,int constant,char *ic,int trace,int approx,
       double offset,double *xreg,int r,int *method)

{
  int iVar1;
  int iVar2;
  int iVar3;
  myarima_object pmVar4;
  double *pdVar5;
  sarimax_object psVar6;
  double *coeff;
  void *__ptr;
  double *ZEROR;
  double *ZEROI;
  int iVar7;
  double dVar8;
  double dVar9;
  int local_124;
  int *K;
  double *zeroi;
  double *zeror;
  double *theta;
  double *phi;
  double *xreg2;
  double temp;
  double tol;
  double minroot;
  double rsum;
  int retval;
  int ir;
  int iq;
  int ip;
  int last_nonzero;
  int rmethod;
  int use_season;
  int rr;
  int imx;
  int isum;
  int ncoeff;
  int imean;
  int j;
  int i;
  int diffs;
  int s;
  int Q;
  int D;
  int P;
  int q;
  int d;
  int p;
  int m;
  myarima_object fit;
  double offset_local;
  char *ic_local;
  int constant_local;
  int *seasonal_local;
  int *order_local;
  int N_local;
  double *x_local;
  
  pmVar4 = (myarima_object)malloc(0x38);
  pmVar4->aicc = 1.79769313486232e+308;
  pmVar4->bic = 1.79769313486232e+308;
  pmVar4->aic = 1.79769313486232e+308;
  pmVar4->ic = 1.79769313486232e+308;
  if (order == (int *)0x0) {
    q = 0;
    P = 0;
    D = 0;
  }
  else {
    q = *order;
    P = order[1];
    D = order[2];
  }
  if (seasonal == (int *)0x0) {
    Q = 0;
    s = 0;
    diffs = 0;
    i = 0;
  }
  else {
    Q = *seasonal;
    s = seasonal[1];
    diffs = seasonal[2];
    i = seasonal[3];
  }
  if (method == (int *)0x0) {
    if (approx == 0) {
      ip = 0;
    }
    else {
      ip = 2;
    }
  }
  else {
    ip = *method;
  }
  if ((P + s == 1) && (constant == 1)) {
    pdVar5 = (double *)malloc((long)N * 8 * (long)(r + 1));
    for (imean = 0; imean < N; imean = imean + 1) {
      pdVar5[imean] = (double)(imean + 1);
    }
    memcpy(pdVar5 + N,xreg,(long)N * 8 * (long)r);
    psVar6 = sarimax_init(q,P,D,Q,s,diffs,i,r + 1,1,N);
    pmVar4->sarimax = psVar6;
    sarimax_exec(pmVar4->sarimax,x,pdVar5);
    free(pdVar5);
  }
  else if (r < 1) {
    psVar6 = sarimax_init(q,P,D,Q,s,diffs,i,0,constant,N);
    pmVar4->sarimax = psVar6;
    sarimax_setMethod(pmVar4->sarimax,ip);
    sarimax_exec(pmVar4->sarimax,x,(double *)0x0);
  }
  else {
    pdVar5 = (double *)malloc((long)N * 8 * (long)r);
    memcpy(pdVar5,xreg,(long)N * 8 * (long)r);
    psVar6 = sarimax_init(q,P,D,Q,s,diffs,i,r,constant,N);
    pmVar4->sarimax = psVar6;
    sarimax_setMethod(pmVar4->sarimax,ip);
    sarimax_exec(pmVar4->sarimax,x,pdVar5);
    free(pdVar5);
  }
  if (pmVar4->sarimax->retval == 1) {
    iVar1 = pmVar4->sarimax->p + pmVar4->sarimax->q + pmVar4->sarimax->P + pmVar4->sarimax->Q +
            pmVar4->sarimax->M;
    iVar2 = iVar1 + 1;
    if (ip == 2) {
      iVar3 = pmVar4->sarimax->Nused;
      dVar8 = log(pmVar4->sarimax->var);
      pmVar4->sarimax->aic = (double)iVar3 * dVar8 + offset + (double)(iVar2 * 2);
    }
    dVar8 = pmVar4->sarimax->aic;
    if ((dVar8 != 0.0) || (NAN(dVar8))) {
      pmVar4->aic = pmVar4->sarimax->aic;
      dVar8 = pmVar4->aic;
      dVar9 = log((double)pmVar4->sarimax->Nused);
      pmVar4->bic = (double)iVar2 * (dVar9 - 2.0) + dVar8;
      pmVar4->aicc = pmVar4->aic +
                     (double)(iVar2 * 2 * (iVar1 + 2)) /
                     (double)((pmVar4->sarimax->Nused - iVar2) + -1);
      iVar1 = strcmp(ic,"aic");
      if (iVar1 == 0) {
        pmVar4->ic = pmVar4->aic;
      }
      else {
        iVar1 = strcmp(ic,"bic");
        if (iVar1 == 0) {
          pmVar4->ic = pmVar4->bic;
        }
        else {
          iVar1 = strcmp(ic,"aicc");
          if (iVar1 == 0) {
            pmVar4->ic = pmVar4->aicc;
          }
        }
      }
    }
    else {
      pmVar4->aicc = 1.79769313486232e+308;
      pmVar4->bic = 1.79769313486232e+308;
      pmVar4->aic = 1.79769313486232e+308;
      pmVar4->ic = 1.79769313486232e+308;
    }
    minroot = 0.0;
    for (imean = 0; imean < pmVar4->sarimax->Nused; imean = imean + 1) {
      minroot = pmVar4->sarimax->res[imean] * pmVar4->sarimax->res[imean] + minroot;
    }
    pmVar4->sigma2 = minroot / (double)((pmVar4->sarimax->Nused - iVar2) + 1);
    tol = 2.0;
    iVar1 = q + i * Q;
    iVar2 = iVar1 + 1;
    iVar3 = D + i * diffs;
    local_124 = iVar3 + 1;
    pdVar5 = (double *)calloc((long)iVar2,8);
    coeff = (double *)calloc((long)local_124,8);
    *coeff = 1.0;
    *pdVar5 = 1.0;
    for (imean = 0; imean < q; imean = imean + 1) {
      pdVar5[imean + 1] = pmVar4->sarimax->phi[imean];
    }
    for (imean = 0; imean < D; imean = imean + 1) {
      coeff[imean + 1] = pmVar4->sarimax->theta[imean] * -1.0;
    }
    for (ncoeff = 0; ncoeff < Q; ncoeff = ncoeff + 1) {
      iVar7 = (ncoeff + 1) * i;
      pdVar5[iVar7] = pmVar4->sarimax->PHI[ncoeff] + pdVar5[iVar7];
      for (imean = 0; imean < q; imean = imean + 1) {
        iVar7 = (ncoeff + 1) * i + imean + 1;
        pdVar5[iVar7] = -pmVar4->sarimax->phi[imean] * pmVar4->sarimax->PHI[ncoeff] + pdVar5[iVar7];
      }
    }
    for (ncoeff = 0; ncoeff < diffs; ncoeff = ncoeff + 1) {
      iVar7 = (ncoeff + 1) * i;
      coeff[iVar7] = coeff[iVar7] - pmVar4->sarimax->THETA[ncoeff];
      for (imean = 0; imean < D; imean = imean + 1) {
        iVar7 = (ncoeff + 1) * i + imean + 1;
        coeff[iVar7] = pmVar4->sarimax->theta[imean] * pmVar4->sarimax->THETA[ncoeff] + coeff[iVar7]
        ;
      }
    }
    if (local_124 < iVar2) {
      local_124 = iVar2;
    }
    __ptr = malloc((long)local_124 << 2);
    ZEROR = (double *)malloc((long)local_124 << 3);
    ZEROI = (double *)malloc((long)local_124 << 3);
    if (0 < q + Q) {
      use_season = -1;
      for (imean = 0; imean < iVar1; imean = imean + 1) {
        *(uint *)((long)__ptr + (long)imean * 4) = (uint)(1e-08 < ABS(pdVar5[imean + 1]));
        if (*(int *)((long)__ptr + (long)imean * 4) == 1) {
          use_season = imean;
        }
      }
      iVar1 = use_season + 1;
      if (0 < iVar1) {
        for (imean = 0; imean < iVar1; imean = imean + 1) {
          pdVar5[imean + 1] = pdVar5[imean + 1] * -1.0;
        }
        iVar2 = polyroot(pdVar5,iVar1,ZEROR,ZEROI);
        if (iVar2 == 0) {
          for (imean = 0; imean < iVar1; imean = imean + 1) {
            dVar8 = sqrt(ZEROR[imean] * ZEROR[imean] + ZEROI[imean] * ZEROI[imean]);
            if (dVar8 < tol) {
              tol = dVar8;
            }
          }
        }
        else {
          pmVar4->ic = 1.79769313486232e+308;
        }
      }
    }
    if ((1 < D + diffs) &&
       (pmVar4->ic <= 1.79769313486232e+308 && pmVar4->ic != 1.79769313486232e+308)) {
      use_season = -1;
      for (imean = 0; imean < iVar3; imean = imean + 1) {
        *(uint *)((long)__ptr + (long)imean * 4) = (uint)(1e-08 < ABS(coeff[imean + 1]));
        if (*(int *)((long)__ptr + (long)imean * 4) == 1) {
          use_season = imean;
        }
      }
      iVar1 = use_season + 1;
      if (0 < iVar1) {
        iVar2 = polyroot(coeff,iVar1,ZEROR,ZEROI);
        if (iVar2 == 0) {
          for (imean = 0; imean < iVar1; imean = imean + 1) {
            dVar8 = sqrt(ZEROR[imean] * ZEROR[imean] + ZEROI[imean] * ZEROI[imean]);
            if (dVar8 < tol) {
              tol = dVar8;
            }
          }
        }
        else {
          pmVar4->ic = 1.79769313486232e+308;
        }
      }
    }
    if (tol < 1.01) {
      pmVar4->ic = 1.79769313486232e+308;
    }
    free(pdVar5);
    free(coeff);
    free(__ptr);
    free(ZEROR);
    free(ZEROI);
  }
  else {
    pmVar4->ic = 1.79769313486232e+308;
  }
  return pmVar4;
}

Assistant:

myarima_object myarima(double *x, int N, int *order, int *seasonal, int constant, const char* ic, int trace, int approx,
	double offset, double *xreg, int r, int *method) {

	myarima_object fit = NULL;
	int m,p,d,q,P,D,Q,s,diffs,i,j,imean,ncoeff,isum,imx,rr;
	int use_season,rmethod,last_nonzero,ip,iq,ir,retval;
	double rsum,minroot,tol,temp;
	double *xreg2,*phi,*theta,*zeror,*zeroi;
	int *K;

	fit = (myarima_object) malloc (sizeof(struct myarima_set));
	
	fit->ic = fit->aic = fit->bic = fit->aicc = DBL_MAX;

	tol = 1e-08;

	if (order) {
		p = order[0];
		d = order[1];
		q = order[2];
	} else {
		p = 0;
		d = 0;
		q = 0;
	}

	if (seasonal) {
		P = seasonal[0];
		D = seasonal[1];
		Q = seasonal[2];
		s = seasonal[3];
		if ( s > 0) {
			m = s;
		} else {
			m = 1;
		}
	} else {
		P = 0;
		D = 0;
		Q = 0;
		s = 0;
		m = 1;
	}

	diffs = d + D;

	if ( P + D + Q > 0 && s > 0) {
		use_season = 1;
	} else {
		use_season = 0;
	}

	if (method == NULL) {
		if (approx) {
			rmethod = 2;
		} else {
			rmethod = 0;
		}
	} else {
		rmethod = *method;
	}

	rr = r;

	if (diffs == 1 && constant == 1) {
		imean = 1;
		rr++;
		xreg2 = (double*)malloc(sizeof(double)*N*rr);
		for(i = 0; i < N;++i) {
			xreg2[i] = (double) (i+1);
		}
		memcpy(xreg2+N,xreg,sizeof(double)*N*(rr-1));
		fit->sarimax = sarimax_init(p,d,q,P,D,Q,s,rr,imean,N);
		sarimax_exec(fit->sarimax,x,xreg2);
		free(xreg2);
		//sarimax_summary(fit->sarimax);
	} else {
		imean = constant;
		if (rr > 0) {
			xreg2 = (double*)malloc(sizeof(double)*N*rr);
			memcpy(xreg2,xreg,sizeof(double)*N*rr);
			fit->sarimax = sarimax_init(p,d,q,P,D,Q,s,rr,imean,N);
			sarimax_setMethod(fit->sarimax,rmethod);
			sarimax_exec(fit->sarimax,x,xreg2);
			free(xreg2);
		} else {
			//printf("p: %d d: %d q: %d P: %d D: %d Q: %d s: %d imean %d \n",p,d,q,P,D,Q,s,imean);
			fit->sarimax = sarimax_init(p,d,q,P,D,Q,s,0,imean,N);
			sarimax_setMethod(fit->sarimax,rmethod);
			//mdisplay(x,1,N);
			sarimax_exec(fit->sarimax,x,NULL);
			//sarimax_summary(fit->sarimax);
		}
		
	}

	if (fit->sarimax->retval == 1) {
		ncoeff = (fit->sarimax->p + fit->sarimax->q + fit->sarimax->P + fit->sarimax->Q + fit->sarimax->M) + 1;

		if (rmethod == 2) {
			fit->sarimax->aic = offset + fit->sarimax->Nused * log(fit->sarimax->var) + 2 * ncoeff;// sigma2 
		}

		if (fit->sarimax->aic) {
			fit->aic = fit->sarimax->aic;
			fit->bic = fit->aic + ncoeff * (log((double)fit->sarimax->Nused) - 2.0);
			fit->aicc = fit->aic + 2 * ncoeff * (ncoeff + 1) / (double) (fit->sarimax->Nused - ncoeff - 1);
			if (!strcmp(ic,"aic")) {
				fit->ic = fit->aic;
			} else if (!strcmp(ic,"bic")) {
				fit->ic = fit->bic;
			} else if (!strcmp(ic,"aicc")) {
				fit->ic = fit->aicc;
			}
		} else {
			fit->ic = fit->aic = fit->bic = fit->aicc = DBL_MAX;
		}

		//printf("aic %g bic %g aicc %g ic %g \n",fit->aic,fit->bic,fit->aicc,fit->ic);

		rsum = 0.0;

		for(i = 0; i < fit->sarimax->Nused;++i) {
			rsum += fit->sarimax->res[i]*fit->sarimax->res[i];
		}

		fit->sigma2 = rsum / (double) (fit->sarimax->Nused - ncoeff + 1);

		minroot = 2.0;

		ip = p + s*P + 1;
		iq = q + s*Q + 1;

		phi = (double*)calloc(ip,sizeof(double));
		theta = (double*)calloc(iq,sizeof(double));

		phi[0] = theta[0] = 1.0;

		for(i = 0; i < p;++i) {
			phi[i+1] = fit->sarimax->phi[i];
		}

		for(i = 0; i < q; ++i) {
			theta[i+1] = -1.0 * fit->sarimax->theta[i];
		}

		for (j = 0; j < P; ++j) {
			phi[(j + 1)*s] += fit->sarimax->PHI[j];
			for (i = 0; i < p; ++i) {
				phi[(j + 1)*s + i + 1] -= fit->sarimax->phi[i] * fit->sarimax->PHI[j];
			}
		}

		for (j = 0; j < Q; ++j) {
			theta[(j + 1)*s] -= fit->sarimax->THETA[j];
			for (i = 0; i < q; ++i) {
				theta[(j + 1)*s + i + 1] += fit->sarimax->theta[i] * fit->sarimax->THETA[j];
			}
		}

		ir = (ip > iq) ? ip : iq;

		K = (int*)malloc(sizeof(int)*ir);
		zeror = (double*)malloc(sizeof(double)*ir);
		zeroi = (double*)malloc(sizeof(double)*ir);

		//printf(" p P %d \n", p+P);

		if (p + P > 0) {
			isum = 0;
			imx = -1;
			for(i = 0; i < ip - 1; ++i) {
				K[i] = (fabs(phi[i+1]) > tol) ? 1 : 0; 
				if (K[i] == 1) {
					isum += 1;
					imx = i;
				}
			}

			last_nonzero = imx + 1;

			if (last_nonzero > 0) {
				for(i = 0; i < last_nonzero; ++i) {
					phi[i+1] *= -1.0;
				}

				retval = polyroot(phi,last_nonzero,zeror,zeroi);

				if (retval == 0) {
					for(i = 0; i < last_nonzero;++i) {
						temp = sqrt(zeror[i]*zeror[i] + zeroi[i]*zeroi[i]);
						if (temp < minroot) minroot = temp;
					}
				} else {
					fit->ic = DBL_MAX;
				}

			}

		}

		//printf(" q Q %d \n", q+Q);

		if (q + Q > 1 && fit->ic < DBL_MAX) {
			isum = 0;
			imx = -1;
			for(i = 0; i < iq - 1; ++i) {
				K[i] = (fabs(theta[i+1]) > tol) ? 1 : 0; 
				if (K[i] == 1) {
					isum += 1;
					imx = i;
				}
			}

			last_nonzero = imx + 1;

			if (last_nonzero > 0) {

				retval = polyroot(theta,last_nonzero,zeror,zeroi);

				if (retval == 0) {
					for(i = 0; i < last_nonzero;++i) {
						temp = sqrt(zeror[i]*zeror[i] + zeroi[i]*zeroi[i]);
						if (temp < minroot) minroot = temp;
					}
				} else {
					fit->ic = DBL_MAX;
				}

			}

			
		}

		if (minroot < 1.01) {
			fit->ic = DBL_MAX;
		}



		free(phi);
		free(theta);
		free(K);
		free(zeror);
		free(zeroi);
	} else {
		fit->ic = DBL_MAX;
	}

	return fit;
}